

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteTextures(ReferenceContext *this,int numTextures,deUint32 *textures)

{
  Texture *local_40;
  Texture *texture;
  deUint32 name;
  int i;
  deUint32 *textures_local;
  int numTextures_local;
  ReferenceContext *this_local;
  
  for (texture._4_4_ = 0; texture._4_4_ < numTextures; texture._4_4_ = texture._4_4_ + 1) {
    if (textures[texture._4_4_] == 0) {
      local_40 = (Texture *)0x0;
    }
    else {
      local_40 = rc::ObjectManager<sglr::rc::Texture>::find
                           (&this->m_textures,textures[texture._4_4_]);
    }
    if (local_40 != (Texture *)0x0) {
      deleteTexture(this,local_40);
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
	{
		deUint32	name		= textures[i];
		Texture*	texture		= name ? m_textures.find(name) : DE_NULL;

		if (texture)
			deleteTexture(texture);
	}
}